

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateInnerProductLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  InnerProductLayerParams *pIVar2;
  WeightParams *bias;
  WeightParams *pWVar3;
  allocator local_89;
  undefined1 local_88 [40];
  string local_60;
  string local_40;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_88,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_88,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_40,"InnerProduct",(allocator *)&local_60);
    validateInputOutputRankEquality((Result *)local_88,layer,&local_40,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_60,"InnerProduct",&local_89);
    validateRankCount((Result *)local_88,layer,&local_60,1,5,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pIVar2 = Specification::NeuralNetworkLayer::innerproduct(layer);
  if (pIVar2->int8dynamicquantize_ == true) {
    pWVar3 = pIVar2->weights_;
    std::__cxx11::string::string((string *)&local_60,"InnerProduct",&local_89);
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    validateInt8Requirements((Result *)local_88,pWVar3,&local_60,(layer->name_).ptr_);
    Result::operator=(__return_storage_ptr__,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pWVar3 = pIVar2->weights_;
  if (pWVar3 == (WeightParams *)0x0) {
    pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  bias = pIVar2->bias_;
  if (bias == (WeightParams *)0x0) {
    bias = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  validateInnerProductWeightsBias((Result *)local_88,layer,pWVar3,bias);
  Result::operator=(__return_storage_ptr__,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateInnerProductLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "InnerProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "InnerProduct", 1, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.innerproduct();
    if (params.int8dynamicquantize()) {
        r = validateInt8Requirements(params.weights(), "InnerProduct", layer.name());
        if (!r.good()) {return r;}
    }

    r = validateInnerProductWeightsBias(layer, params.weights(), params.bias());

    return r;
}